

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O0

thread_pool * __thiscall cppcms::service::thread_pool(service *this)

{
  pointer ptVar1;
  service *psVar2;
  type ptVar3;
  hold_ptr<cppcms::impl::service> *in_RDI;
  unique_ptr<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_> *__p;
  unique_ptr<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_>
  *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffec;
  thread_pool *in_stack_fffffffffffffff0;
  
  booster::hold_ptr<cppcms::impl::service>::operator->(in_RDI);
  ptVar1 = std::unique_ptr<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_>::get
                     (in_stack_ffffffffffffffd0);
  if (ptVar1 == (pointer)0x0) {
    psVar2 = booster::hold_ptr<cppcms::impl::service>::operator->(in_RDI);
    __p = &psVar2->thread_pool_;
    in_stack_ffffffffffffffd0 =
         (unique_ptr<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_> *)
         operator_new(8);
    threads_no((service *)0x366c85);
    cppcms::thread_pool::thread_pool(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
    std::unique_ptr<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_>::reset
              (in_stack_ffffffffffffffd0,(pointer)__p);
  }
  booster::hold_ptr<cppcms::impl::service>::operator->(in_RDI);
  ptVar3 = std::unique_ptr<cppcms::thread_pool,_std::default_delete<cppcms::thread_pool>_>::
           operator*(in_stack_ffffffffffffffd0);
  return ptVar3;
}

Assistant:

cppcms::thread_pool &service::thread_pool()
{
	if(!impl_->thread_pool_.get()) {
		impl_->thread_pool_.reset(new cppcms::thread_pool(threads_no()));
	}
	return *impl_->thread_pool_;
}